

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPPDUHandler.cpp
# Opt level: O0

bool handleGetRequestPDU(deque<ValueCallback_*,_std::allocator<ValueCallback_*>_> *callbacks,
                        deque<VarBind,_std::allocator<VarBind>_> *varbindList,
                        deque<VarBind,_std::allocator<VarBind>_> *outResponseList,
                        SNMP_VERSION snmpVersion,bool isGetNextRequest)

{
  ValueCallback *__args;
  bool bVar1;
  element_type *oid;
  ERROR_STATUS_WITH_VALUE local_d4;
  undefined1 local_d0 [8];
  shared_ptr<BER_CONTAINER> value;
  shared_ptr<ImplicitNullType> local_b8 [2];
  undefined4 local_94;
  shared_ptr<ImplicitNullType> local_90;
  ValueCallback *local_80;
  ValueCallback *callback;
  VarBind *requestVarBind;
  iterator __end1;
  iterator __begin1;
  deque<VarBind,_std::allocator<VarBind>_> *__range1;
  bool isGetNextRequest_local;
  SNMP_VERSION snmpVersion_local;
  deque<VarBind,_std::allocator<VarBind>_> *outResponseList_local;
  deque<VarBind,_std::allocator<VarBind>_> *varbindList_local;
  deque<ValueCallback_*,_std::allocator<ValueCallback_*>_> *callbacks_local;
  
  std::deque<VarBind,_std::allocator<VarBind>_>::begin((iterator *)&__end1._M_node,varbindList);
  std::deque<VarBind,_std::allocator<VarBind>_>::end((iterator *)&requestVarBind,varbindList);
  while (bVar1 = std::operator!=((_Self *)&__end1._M_node,(_Self *)&requestVarBind), bVar1) {
    callback = (ValueCallback *)
               Catch::clara::std::_Deque_iterator<VarBind,_VarBind_&,_VarBind_*>::operator*
                         ((_Deque_iterator<VarBind,_VarBind_&,_VarBind_*> *)&__end1._M_node);
    oid = Catch::clara::std::__shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>::get
                    ((__shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2> *)callback);
    local_80 = ValueCallback::findCallback(callbacks,oid,isGetNextRequest,0,(size_t *)0x0);
    __args = callback;
    if (local_80 == (ValueCallback *)0x0) {
      if (isGetNextRequest) {
        local_94 = 0x82;
        std::make_shared<ImplicitNullType,ASN_TYPE_WITH_VALUE>((ASN_TYPE_WITH_VALUE *)&local_90);
        std::deque<VarBind,std::allocator<VarBind>>::
        emplace_back<VarBind_const&,std::shared_ptr<ImplicitNullType>>
                  ((deque<VarBind,std::allocator<VarBind>> *)outResponseList,(VarBind *)__args,
                   &local_90);
        std::shared_ptr<ImplicitNullType>::~shared_ptr(&local_90);
      }
      else {
        value.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
             = 0x80;
        std::make_shared<ImplicitNullType,ASN_TYPE_WITH_VALUE>((ASN_TYPE_WITH_VALUE *)local_b8);
        std::deque<VarBind,std::allocator<VarBind>>::
        emplace_back<VarBind_const&,std::shared_ptr<ImplicitNullType>>
                  ((deque<VarBind,std::allocator<VarBind>> *)outResponseList,(VarBind *)__args,
                   local_b8);
        std::shared_ptr<ImplicitNullType>::~shared_ptr(local_b8);
      }
    }
    else {
      ValueCallback::getValueForCallback((ValueCallback *)local_d0,local_80);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_d0);
      if (bVar1) {
        std::deque<VarBind,std::allocator<VarBind>>::
        emplace_back<SortableOIDType*const&,std::shared_ptr<BER_CONTAINER>&>
                  ((deque<VarBind,std::allocator<VarBind>> *)outResponseList,&local_80->OID,
                   (shared_ptr<BER_CONTAINER> *)local_d0);
      }
      else {
        local_d4 = GEN_ERR;
        std::deque<VarBind,std::allocator<VarBind>>::
        emplace_back<SortableOIDType*const&,ERROR_STATUS_WITH_VALUE>
                  ((deque<VarBind,std::allocator<VarBind>> *)outResponseList,&local_80->OID,
                   &local_d4);
      }
      Catch::clara::std::shared_ptr<BER_CONTAINER>::~shared_ptr
                ((shared_ptr<BER_CONTAINER> *)local_d0);
    }
    std::_Deque_iterator<VarBind,_VarBind_&,_VarBind_*>::operator++
              ((_Deque_iterator<VarBind,_VarBind_&,_VarBind_*> *)&__end1._M_node);
  }
  return true;
}

Assistant:

bool handleGetRequestPDU(std::deque<ValueCallback*> &callbacks, std::deque<VarBind> &varbindList, std::deque<VarBind> &outResponseList, SNMP_VERSION snmpVersion, bool isGetNextRequest){
    SNMP_LOGD("handleGetRequestPDU\n");
    for(const VarBind& requestVarBind : varbindList){
        SNMP_LOGD("finding callback for OID: %s\n", requestVarBind.oid->string().c_str());
        ValueCallback* callback = ValueCallback::findCallback(callbacks, requestVarBind.oid.get(), isGetNextRequest);
        if(!callback){
            SNMP_LOGD("Couldn't find callback\n");
#if 1
            // According to RFC3416 we should be setting the value to 'noSuchObject' or 'noSuchInstance,
            // but this doesn't seem to render nicely in tools, so possibly revert to old NO_SUCH_NAME error
            if(isGetNextRequest){
                // if it's a walk it's an endOfMibView
                outResponseList.emplace_back(requestVarBind, std::make_shared<ImplicitNullType>(ENDOFMIBVIEW));
            } else {
                outResponseList.emplace_back(requestVarBind, std::make_shared<ImplicitNullType>(NOSUCHOBJECT));
            }

#else
            outResponseList.emplace_back(generateErrorResponse(SNMP_ERROR_VERSION_CTRL_DEF(NOT_WRITABLE, snmpVersion, NO_SUCH_NAME), requestVarBind.oid));
#endif
            continue;
        }

        SNMP_LOGD("Callback found with OID: %s\n", callback->OID->string().c_str());
        //NOTE: we could just use the same pointer as the reqwuest, but delete the value and add a new one. Will have to figure out what to do if it errors, do that later
        auto value = ValueCallback::getValueForCallback(callback);

        if(!value){
            SNMP_LOGD("Couldn't get value for callback\n");
            outResponseList.emplace_back(callback->OID, SNMP_ERROR_VERSION_CTRL(GEN_ERR, snmpVersion));
            continue;   
        }

        outResponseList.emplace_back(callback->OID, value);
    }
    return true; // we didn't fail in our job, even if we filled in nothing
}